

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
ElementsTransactionApi_FundRawTransaction_emptyUtxo_Test::TestBody
          (ElementsTransactionApi_FundRawTransaction_emptyUtxo_Test *this)

{
  bool bVar1;
  char *pcVar2;
  undefined1 extraout_DL;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_bool>
  pVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  CfdException *except;
  ConfidentialTransactionController ctx;
  ElementsTransactionApi api;
  ElementsUtxoAndOption utxo_data1;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  Script claim_script;
  Transaction tx;
  ConfidentialTransactionContext txc;
  CoinSelectionOption option;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  append_txout_addresses;
  UtxoFilter filter;
  Amount estimate_fee;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  selected_txin_utxos;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  reserve_txout_address;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  map_target_value;
  ConfidentialAssetId fee_asset;
  double fee_rate;
  UtxoData utxo1;
  ConfidentialAssetId asset;
  ElementsAddressFactory factory;
  Script *in_stack_ffffffffffffec30;
  ElementsUtxoAndOption *this_00;
  undefined4 in_stack_ffffffffffffec38;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffec3c;
  ElementsUtxoAndOption *in_stack_ffffffffffffec40;
  CoinSelectionOption *this_01;
  vector *lhs_expression;
  undefined4 in_stack_ffffffffffffec64;
  AssertHelper local_12b0;
  Message local_12a8;
  undefined4 local_12a0;
  undefined4 local_129c;
  AssertionResult local_1298;
  AssertHelper local_1288;
  Message local_1280;
  string local_1278 [32];
  AssertionResult local_1258;
  AssertHelper local_1248;
  Message local_1240;
  undefined8 local_1238;
  undefined8 local_1230;
  undefined1 local_1228;
  undefined8 local_1220;
  undefined1 local_1218;
  undefined8 local_1210;
  AssertionResult local_1208 [3];
  string local_11d0 [32];
  ConfidentialTransactionContext local_11b0 [184];
  map local_10f8 [32];
  string local_10d8 [87];
  ElementsTransactionApi local_1081;
  UtxoData local_1080 [1266];
  undefined1 local_b8e;
  undefined4 local_b8c;
  Script local_b88;
  undefined4 local_b50;
  vector local_b48 [31];
  allocator local_b29;
  string local_b28 [32];
  Script local_b08;
  allocator local_ac9;
  string local_ac8 [32];
  Transaction local_aa8 [71];
  allocator local_a61;
  string local_a60 [32];
  ConfidentialAssetId local_a40 [4];
  ConfidentialAssetId local_988 [2];
  vector local_920 [28];
  vector local_904 [4];
  Amount local_900 [16];
  ConfidentialAssetId local_8f0;
  string local_8c8 [32];
  undefined1 local_8a8 [48];
  _Base_ptr local_878;
  undefined1 local_870;
  Amount local_868 [16];
  string local_858 [32];
  map local_838 [48];
  undefined1 local_808 [40];
  double local_7e0;
  Amount local_7d8 [23];
  allocator local_7c1;
  string local_7c0 [32];
  string local_7a0 [383];
  allocator local_621;
  string local_620 [32];
  Script local_600;
  allocator local_5c1;
  string local_5c0 [32];
  Txid local_5a0;
  undefined8 local_580 [5];
  Txid local_558;
  undefined4 local_538;
  Script local_530 [2];
  Address local_4c0 [376];
  string local_348 [48];
  undefined4 local_318;
  _func_int **local_310;
  ConfidentialAssetId local_308 [16];
  allocator local_79;
  string local_78 [32];
  ConfidentialAssetId local_58;
  ElementsAddressFactory local_30 [48];
  
  cfd::Initialize();
  cfd::ElementsAddressFactory::ElementsAddressFactory(local_30,kLiquidV1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_78,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",&local_79);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_58,local_78);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  cfd::UtxoData::UtxoData((UtxoData *)local_580);
  local_580[0] = 0;
  local_310 = (_func_int **)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_5c0,"5e5fd4e860d999b30b268ed583dfcfe805c395f8290d8307f6617fdc3f029de3",&local_5c1
            );
  cfd::core::Txid::Txid(&local_5a0,local_5c0);
  cfd::core::Txid::operator=(&local_558,&local_5a0);
  cfd::core::Txid::~Txid((Txid *)0x298c8f);
  std::__cxx11::string::~string(local_5c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
  local_538 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_620,"0014860d7bed1010c2ccb5247889daa5c58023fa9f8d",&local_621);
  cfd::core::Script::Script(&local_600,local_620);
  cfd::core::Script::operator=(local_530,&local_600);
  cfd::core::Script::~Script(in_stack_ffffffffffffec30);
  std::__cxx11::string::~string(local_620);
  std::allocator<char>::~allocator((allocator<char> *)&local_621);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7c0,"ert1qscxhhmgszrpvedfy0zya4fw9sq3l48udr728gs",&local_7c1);
  cfd::AddressFactory::GetAddress(local_7a0);
  cfd::core::Address::operator=(local_4c0,(Address *)local_7a0);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffec30);
  std::__cxx11::string::~string(local_7c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7c1);
  std::__cxx11::string::operator=
            (local_348,"wpkh(02db28ad892aa1e500d1e88ffa24200088bc82a8a87807cd13a1d1a1c7799c41e5)");
  cfd::core::Amount::Amount(local_7d8,0x5f5df0c);
  local_348[0x28] = (string)local_7d8[8];
  local_348[0x20] = (string)local_7d8[0];
  local_348[0x21] = (string)local_7d8[1];
  local_348[0x22] = (string)local_7d8[2];
  local_348[0x23] = (string)local_7d8[3];
  local_348[0x24] = (string)local_7d8[4];
  local_348[0x25] = (string)local_7d8[5];
  local_348[0x26] = (string)local_7d8[6];
  local_348[0x27] = (string)local_7d8[7];
  local_318._0_1_ = true;
  local_318._1_1_ = false;
  local_318._2_1_ = false;
  local_318._3_1_ = 0;
  cfd::core::ConfidentialAssetId::operator=(local_308,&local_58);
  local_7e0 = 0.15;
  cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)local_808,&local_58);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
         *)0x298e6c);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  cfd::core::Amount::Amount(local_868);
  pVar3 = std::
          map<std::__cxx11::string,cfd::core::Amount,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
          ::emplace<std::__cxx11::string,cfd::core::Amount>
                    ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
                      *)in_stack_ffffffffffffec40,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffec3c,in_stack_ffffffffffffec38),
                     (Amount *)in_stack_ffffffffffffec30);
  local_878 = (_Base_ptr)pVar3.first._M_node;
  local_870 = pVar3.second;
  std::__cxx11::string::~string(local_858);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x298ef8);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  pVar4 = std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::emplace<std::__cxx11::string,char_const(&)[102]>
                    ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_ffffffffffffec40,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffec3c,in_stack_ffffffffffffec38),
                     (char (*) [102])in_stack_ffffffffffffec30);
  local_8f0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pVar4.first._M_node;
  local_8f0.version_ = pVar4.second;
  std::__cxx11::string::~string(local_8c8);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
          *)0x298f74);
  cfd::core::Amount::Amount(local_900);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x298f90);
  cfd::CoinSelectionOption::CoinSelectionOption((CoinSelectionOption *)local_988);
  cfd::CoinSelectionOption::InitializeConfidentialTxSizeInfo();
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate(local_7e0);
  cfd::CoinSelectionOption::SetLongTermFeeBaserate(local_7e0);
  cfd::CoinSelectionOption::SetFeeAsset(local_988);
  cfd::CoinSelectionOption::SetBlindInfo((int)local_988,0);
  cfd::CoinSelectionOption::SetKnapsackMinimumChange((long)local_988);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a60,
             "020000000101e39d023fdc7f61f607830d29f895c305e8cfdf83d58e260bb399d960e8d45f5e0000004000ffffffff000000000000000006080cdff505000000002025b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f160014f3ea0aba73fdb23912ebd21f46e156cdd9e94280c0020000000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff010cdff5050000000017a9141500eb4946dee5979e708c8b2c6d090773f3b8d1870247304402204d9faa0b3b9c76b3ee875ae9205b50e05c2d0a8dff8e26d269f68eb72531af1402201f71d1e2bec6b7ea90d45dec158d3f85942e0fc09cfad29d917d3cbc6acd981d012103b64236b2c8f34a18e3a584fe0877fb944e2abb4544cb14bee5458bcc2480cefc000000009700000020fe3b574c1ce6d5cb68fc518e86f7976e599fafc0a2e5754aace7ca16d97a7c78ef9325b8d4f0a4921e060fc5e71435f46a18fa339688142cd4b028c8488c9f8dd1495b5dffff7f200200000002000000024a180a6822abffc3b1080c49016899c6dac25083936df14af12f58db11958ef27926299350fdc2f4d0da1d4f0fbbd3789d29f9dc016358ae42463c0cebf393f30105"
             ,&local_a61);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_a40,local_a60);
  std::__cxx11::string::~string(local_a60);
  std::allocator<char>::~allocator((allocator<char> *)&local_a61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_ac8,
             "020000000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff010cdff5050000000017a9141500eb4946dee5979e708c8b2c6d090773f3b8d1870247304402204d9faa0b3b9c76b3ee875ae9205b50e05c2d0a8dff8e26d269f68eb72531af1402201f71d1e2bec6b7ea90d45dec158d3f85942e0fc09cfad29d917d3cbc6acd981d012103b64236b2c8f34a18e3a584fe0877fb944e2abb4544cb14bee5458bcc2480cefc00000000"
             ,&local_ac9);
  cfd::core::Transaction::Transaction(local_aa8,local_ac8);
  std::__cxx11::string::~string(local_ac8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ac9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b28,"0014f3ea0aba73fdb23912ebd21f46e156cdd9e94280",&local_b29);
  cfd::core::Script::Script(&local_b08,local_b28);
  std::__cxx11::string::~string(local_b28);
  std::allocator<char>::~allocator((allocator<char> *)&local_b29);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x299157);
  cfd::api::ElementsUtxoAndOption::ElementsUtxoAndOption(in_stack_ffffffffffffec40);
  cfd::UtxoData::operator=(local_1080,(UtxoData *)local_580);
  local_b8e = 1;
  cfd::core::Script::operator=(&local_b88,&local_b08);
  local_b8c = cfd::core::Transaction::GetTotalSize();
  local_b50 = 0xfa;
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  push_back((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
             *)in_stack_ffffffffffffec40,
            (value_type *)CONCAT44(in_stack_ffffffffffffec3c,in_stack_ffffffffffffec38));
  cfd::api::ElementsTransactionApi::ElementsTransactionApi(&local_1081);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  lhs_expression = local_904;
  this_01 = (CoinSelectionOption *)local_900;
  this_00 = (ElementsUtxoAndOption *)local_808;
  uVar5 = 1;
  cfd::api::ElementsTransactionApi::FundRawTransaction
            (local_10d8,(vector *)&local_1081,local_10f8,local_b48,local_838,&local_8f0,
             SUB81(local_8a8,0),local_7e0,(Amount *)this_00,
             (UtxoFilter *)CONCAT44(in_stack_ffffffffffffec3c,1),this_01,lhs_expression,
             (NetType)local_988,local_920,(Amount *)CONCAT44(in_stack_ffffffffffffec64,4));
  std::__cxx11::string::~string((string *)local_10f8);
  cfd::AbstractTransactionController::GetHex_abi_cxx11_();
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(local_11b0,local_11d0);
  cfd::ConfidentialTransactionContext::operator=
            ((ConfidentialTransactionContext *)local_a40,local_11b0);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)this_00);
  std::__cxx11::string::~string(local_11d0);
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController
            ((ConfidentialTransactionController *)this_00);
  local_1230 = cfd::ConfidentialTransactionContext::GetFeeAmount(local_a40);
  local_1228 = extraout_DL;
  local_1220 = local_1230;
  local_1218 = extraout_DL;
  local_1210 = cfd::core::Amount::GetSatoshiValue();
  local_1238 = cfd::core::Amount::GetSatoshiValue();
  testing::internal::EqHelper<false>::Compare<long,long>
            ((char *)lhs_expression,(char *)this_01,
             (long *)CONCAT44(in_stack_ffffffffffffec3c,uVar5),(long *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1208);
  if (!bVar1) {
    testing::Message::Message(&local_1240);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x299ab6);
    testing::internal::AssertHelper::AssertHelper
              (&local_1248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x56f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1248,&local_1240);
    testing::internal::AssertHelper::~AssertHelper(&local_1248);
    testing::Message::~Message((Message *)0x299b13);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x299b6b);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_1258,"txc.GetHex().c_str()",
             "\"020000000101e39d023fdc7f61f607830d29f895c305e8cfdf83d58e260bb399d960e8d45f5e0000004000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000000d500000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000005f5de3702fe5ec67a3f8f932a9c7b987e501f105362630fc2576d5174506dde5a94902dd7160014a7b2b1da77ffa99d565b00d9f7b1c2e44a6907a80000000000000006080cdff505000000002025b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f160014f3ea0aba73fdb23912ebd21f46e156cdd9e94280c0020000000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff010cdff5050000000017a9141500eb4946dee5979e708c8b2c6d090773f3b8d1870247304402204d9faa0b3b9c76b3ee875ae9205b50e05c2d0a8dff8e26d269f68eb72531af1402201f71d1e2bec6b7ea90d45dec158d3f85942e0fc09cfad29d917d3cbc6acd981d012103b64236b2c8f34a18e3a584fe0877fb944e2abb4544cb14bee5458bcc2480cefc000000009700000020fe3b574c1ce6d5cb68fc518e86f7976e599fafc0a2e5754aace7ca16d97a7c78ef9325b8d4f0a4921e060fc5e71435f46a18fa339688142cd4b028c8488c9f8dd1495b5dffff7f200200000002000000024a180a6822abffc3b1080c49016899c6dac25083936df14af12f58db11958ef27926299350fdc2f4d0da1d4f0fbbd3789d29f9dc016358ae42463c0cebf393f3010500000000\""
             ,pcVar2,
             "020000000101e39d023fdc7f61f607830d29f895c305e8cfdf83d58e260bb399d960e8d45f5e0000004000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000000d500000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000005f5de3702fe5ec67a3f8f932a9c7b987e501f105362630fc2576d5174506dde5a94902dd7160014a7b2b1da77ffa99d565b00d9f7b1c2e44a6907a80000000000000006080cdff505000000002025b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f160014f3ea0aba73fdb23912ebd21f46e156cdd9e94280c0020000000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff010cdff5050000000017a9141500eb4946dee5979e708c8b2c6d090773f3b8d1870247304402204d9faa0b3b9c76b3ee875ae9205b50e05c2d0a8dff8e26d269f68eb72531af1402201f71d1e2bec6b7ea90d45dec158d3f85942e0fc09cfad29d917d3cbc6acd981d012103b64236b2c8f34a18e3a584fe0877fb944e2abb4544cb14bee5458bcc2480cefc000000009700000020fe3b574c1ce6d5cb68fc518e86f7976e599fafc0a2e5754aace7ca16d97a7c78ef9325b8d4f0a4921e060fc5e71435f46a18fa339688142cd4b028c8488c9f8dd1495b5dffff7f200200000002000000024a180a6822abffc3b1080c49016899c6dac25083936df14af12f58db11958ef27926299350fdc2f4d0da1d4f0fbbd3789d29f9dc016358ae42463c0cebf393f3010500000000"
            );
  std::__cxx11::string::~string(local_1278);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1258);
  if (!bVar1) {
    testing::Message::Message(&local_1280);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x299c52);
    testing::internal::AssertHelper::AssertHelper
              (&local_1288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x570,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1288,&local_1280);
    testing::internal::AssertHelper::~AssertHelper(&local_1288);
    testing::Message::~Message((Message *)0x299caf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x299d07);
  local_129c = cfd::core::ConfidentialTransaction::GetVsize();
  local_12a0 = 0x133;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((char *)lhs_expression,(char *)this_01,
             (uint *)CONCAT44(in_stack_ffffffffffffec3c,uVar5),(int *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1298);
  if (!bVar1) {
    testing::Message::Message(&local_12a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x299dc6);
    testing::internal::AssertHelper::AssertHelper
              (&local_12b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x571,pcVar2);
    testing::internal::AssertHelper::operator=(&local_12b0,&local_12a8);
    testing::internal::AssertHelper::~AssertHelper(&local_12b0);
    testing::Message::~Message((Message *)0x299e23);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x299e7b);
  cfd::api::ElementsUtxoAndOption::~ElementsUtxoAndOption(this_00);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)this_01);
  cfd::core::Script::~Script((Script *)this_00);
  cfd::core::Transaction::~Transaction((Transaction *)this_00);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)this_00);
  cfd::CoinSelectionOption::~CoinSelectionOption((CoinSelectionOption *)0x299ec9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_01);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  ~vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
           *)this_01);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x299ef0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
          *)0x299efd);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x299f0a);
  cfd::UtxoData::~UtxoData(&this_00->utxo);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x299f24);
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x299f31);
  return;
}

Assistant:

TEST(ElementsTransactionApi, FundRawTransaction_emptyUtxo) {
  cfd::Initialize();
  ElementsAddressFactory factory(NetType::kLiquidV1);
  ConfidentialAssetId asset("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");
  // Address1
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("5e5fd4e860d999b30b268ed583dfcfe805c395f8290d8307f6617fdc3f029de3");
  utxo1.vout = 0;
  utxo1.locking_script = Script("0014860d7bed1010c2ccb5247889daa5c58023fa9f8d");
  // utxo1.redeem_script = Script("");
  utxo1.address = factory.GetAddress("ert1qscxhhmgszrpvedfy0zya4fw9sq3l48udr728gs");
  utxo1.descriptor = "wpkh(02db28ad892aa1e500d1e88ffa24200088bc82a8a87807cd13a1d1a1c7799c41e5)";
  utxo1.amount = Amount(int64_t{99999500});
  utxo1.address_type = AddressType::kP2wpkhAddress;
  utxo1.asset = asset;

  double fee_rate = 0.15;
  ConfidentialAssetId fee_asset = asset;
  std::map<std::string, Amount> map_target_value;
  map_target_value.emplace(asset.GetHex(), Amount());
  std::map<std::string, std::string> reserve_txout_address;
  reserve_txout_address.emplace(asset.GetHex(), "el1qqtl9a3n6878ex25u0wv8u5qlzpfkycc0cftk65t52pkauk55jqka0fajk8d80lafn4t9kqxe77cu9ez2dyr6sq54lwy009uex");
  std::vector<ElementsUtxoAndOption> selected_txin_utxos;
  Amount estimate_fee;
  UtxoFilter filter;
  std::vector<std::string> append_txout_addresses;
  CoinSelectionOption option;
  option.InitializeConfidentialTxSizeInfo();
  option.SetEffectiveFeeBaserate(fee_rate);
  option.SetLongTermFeeBaserate(fee_rate);
  option.SetFeeAsset(fee_asset);
  option.SetBlindInfo(0, 52);
  option.SetKnapsackMinimumChange(0);

  ConfidentialTransactionContext txc("020000000101e39d023fdc7f61f607830d29f895c305e8cfdf83d58e260bb399d960e8d45f5e0000004000ffffffff000000000000000006080cdff505000000002025b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f160014f3ea0aba73fdb23912ebd21f46e156cdd9e94280c0020000000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff010cdff5050000000017a9141500eb4946dee5979e708c8b2c6d090773f3b8d1870247304402204d9faa0b3b9c76b3ee875ae9205b50e05c2d0a8dff8e26d269f68eb72531af1402201f71d1e2bec6b7ea90d45dec158d3f85942e0fc09cfad29d917d3cbc6acd981d012103b64236b2c8f34a18e3a584fe0877fb944e2abb4544cb14bee5458bcc2480cefc000000009700000020fe3b574c1ce6d5cb68fc518e86f7976e599fafc0a2e5754aace7ca16d97a7c78ef9325b8d4f0a4921e060fc5e71435f46a18fa339688142cd4b028c8488c9f8dd1495b5dffff7f200200000002000000024a180a6822abffc3b1080c49016899c6dac25083936df14af12f58db11958ef27926299350fdc2f4d0da1d4f0fbbd3789d29f9dc016358ae42463c0cebf393f30105");
  cfd::core::Transaction tx(
    "020000000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff010cdff5050000000017a9141500eb4946dee5979e708c8b2c6d090773f3b8d1870247304402204d9faa0b3b9c76b3ee875ae9205b50e05c2d0a8dff8e26d269f68eb72531af1402201f71d1e2bec6b7ea90d45dec158d3f85942e0fc09cfad29d917d3cbc6acd981d012103b64236b2c8f34a18e3a584fe0877fb944e2abb4544cb14bee5458bcc2480cefc00000000");
  Script claim_script("0014f3ea0aba73fdb23912ebd21f46e156cdd9e94280");
  std::vector<cfd::UtxoData> utxos;
  ElementsUtxoAndOption utxo_data1;
  utxo_data1.utxo = utxo1;
  utxo_data1.is_pegin = true;
  utxo_data1.claim_script = claim_script;
  utxo_data1.pegin_btc_tx_size = tx.GetTotalSize();
  utxo_data1.pegin_txoutproof_size = 250;  // dummy
  selected_txin_utxos.push_back(utxo_data1);

  try {
    ElementsTransactionApi api;
    ConfidentialTransactionController ctx = api.FundRawTransaction(
        txc.GetHex(), utxos, map_target_value, selected_txin_utxos,
        reserve_txout_address, fee_asset, true, fee_rate, &estimate_fee,
        &filter, &option, &append_txout_addresses, NetType::kElementsRegtest);
    txc = ConfidentialTransactionContext(ctx.GetHex());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  EXPECT_EQ(txc.GetFeeAmount().GetSatoshiValue(), estimate_fee.GetSatoshiValue());
  EXPECT_STREQ(txc.GetHex().c_str(), "020000000101e39d023fdc7f61f607830d29f895c305e8cfdf83d58e260bb399d960e8d45f5e0000004000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000000d500000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000005f5de3702fe5ec67a3f8f932a9c7b987e501f105362630fc2576d5174506dde5a94902dd7160014a7b2b1da77ffa99d565b00d9f7b1c2e44a6907a80000000000000006080cdff505000000002025b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f160014f3ea0aba73fdb23912ebd21f46e156cdd9e94280c0020000000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff010cdff5050000000017a9141500eb4946dee5979e708c8b2c6d090773f3b8d1870247304402204d9faa0b3b9c76b3ee875ae9205b50e05c2d0a8dff8e26d269f68eb72531af1402201f71d1e2bec6b7ea90d45dec158d3f85942e0fc09cfad29d917d3cbc6acd981d012103b64236b2c8f34a18e3a584fe0877fb944e2abb4544cb14bee5458bcc2480cefc000000009700000020fe3b574c1ce6d5cb68fc518e86f7976e599fafc0a2e5754aace7ca16d97a7c78ef9325b8d4f0a4921e060fc5e71435f46a18fa339688142cd4b028c8488c9f8dd1495b5dffff7f200200000002000000024a180a6822abffc3b1080c49016899c6dac25083936df14af12f58db11958ef27926299350fdc2f4d0da1d4f0fbbd3789d29f9dc016358ae42463c0cebf393f3010500000000");
  EXPECT_EQ(txc.GetVsize(), 307);
}